

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

MakeNet * __thiscall
notch::core::MakeNet::addFC(MakeNet *this,Array *weights,Array *bias,Activation *af)

{
  size_t sVar1;
  size_t sVar2;
  logic_error *this_00;
  value_type local_84;
  undefined1 local_80 [8];
  MakeLayer mk;
  size_t w_cols;
  size_t w_rows;
  Activation *af_local;
  Array *bias_local;
  Array *weights_local;
  MakeNet *this_local;
  
  sVar1 = std::valarray<float>::size(bias);
  sVar2 = std::valarray<float>::size(weights);
  if (sVar2 / sVar1 != this->nOutputs) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    ::std::logic_error::logic_error(this_00,"cannot add a layer with an incompatible weight matrix")
    ;
    __cxa_throw(this_00,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
  }
  checkConfig(this);
  MakeLayer::MakeLayer((MakeLayer *)local_80,weights,bias,af);
  std::vector<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>::push_back
            (&this->layerMakers,(MakeLayer *)local_80);
  local_84 = FC;
  std::vector<notch::core::MakeNet::LayerType,_std::allocator<notch::core::MakeNet::LayerType>_>::
  push_back(&this->layerTypes,&local_84);
  this->nOutputs = sVar1;
  MakeLayer::~MakeLayer((MakeLayer *)local_80);
  return this;
}

Assistant:

MakeNet &addFC(const Array &weights, const Array &bias,
                   const Activation &af = scaledTanh) {
        size_t w_rows = bias.size();
        size_t w_cols = weights.size() / w_rows;
        if (w_cols != nOutputs) {
            throw std::logic_error("cannot add a layer with an incompatible weight matrix");
        }
        checkConfig();
        MakeLayer mk(weights, bias, af);
        layerMakers.push_back(mk);
        layerTypes.push_back(LayerType::FC);
        nOutputs = w_rows;
        return *this;
    }